

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseStats::TestCaseStats(TestCaseStats *this,TestCaseStats *param_1)

{
  pointer pcVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00195ea0;
  TestCaseInfo::TestCaseInfo(&this->testInfo,&param_1->testInfo);
  (this->totals).testCases.failedButOk = (param_1->totals).testCases.failedButOk;
  iVar2 = (param_1->totals).error;
  uVar3 = *(undefined4 *)&(param_1->totals).field_0x4;
  sVar9 = (param_1->totals).assertions.passed;
  uVar4 = *(undefined4 *)((long)&(param_1->totals).assertions.passed + 4);
  sVar10 = (param_1->totals).assertions.failed;
  uVar5 = *(undefined4 *)((long)&(param_1->totals).assertions.failed + 4);
  sVar11 = (param_1->totals).assertions.failedButOk;
  uVar6 = *(undefined4 *)((long)&(param_1->totals).assertions.failedButOk + 4);
  uVar7 = *(undefined4 *)((long)&(param_1->totals).testCases.passed + 4);
  sVar12 = (param_1->totals).testCases.failed;
  uVar8 = *(undefined4 *)((long)&(param_1->totals).testCases.failed + 4);
  *(int *)&(this->totals).testCases.passed = (int)(param_1->totals).testCases.passed;
  *(undefined4 *)((long)&(this->totals).testCases.passed + 4) = uVar7;
  *(int *)&(this->totals).testCases.failed = (int)sVar12;
  *(undefined4 *)((long)&(this->totals).testCases.failed + 4) = uVar8;
  *(int *)&(this->totals).assertions.failed = (int)sVar10;
  *(undefined4 *)((long)&(this->totals).assertions.failed + 4) = uVar5;
  *(int *)&(this->totals).assertions.failedButOk = (int)sVar11;
  *(undefined4 *)((long)&(this->totals).assertions.failedButOk + 4) = uVar6;
  (this->totals).error = iVar2;
  *(undefined4 *)&(this->totals).field_0x4 = uVar3;
  *(int *)&(this->totals).assertions.passed = (int)sVar9;
  *(undefined4 *)((long)&(this->totals).assertions.passed + 4) = uVar4;
  (this->stdOut)._M_dataplus._M_p = (pointer)&(this->stdOut).field_2;
  pcVar1 = (param_1->stdOut)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stdOut,pcVar1,pcVar1 + (param_1->stdOut)._M_string_length);
  (this->stdErr)._M_dataplus._M_p = (pointer)&(this->stdErr).field_2;
  pcVar1 = (param_1->stdErr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stdErr,pcVar1,pcVar1 + (param_1->stdErr)._M_string_length);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestCaseStats( TestCaseStats const& )              = default;